

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_info.h
# Opt level: O2

string __thiscall BlockInfo::ToString(BlockInfo *this)

{
  DatanodeInfo DStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  undefined1 local_20 [8];
  
  std::to_string((unsigned_long_long)local_20);
  std::operator+((char *)&DStack_68.port_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"BlockInfo:: "
                );
  std::operator+(&local_48,(char *)&DStack_68.port_);
  std::to_string((unsigned_long_long)&DStack_68.location_class_);
  std::operator+(&local_40,&local_48);
  std::operator+(&local_38,(char *)&local_40);
  std::to_string((int)&DStack_68 + 8);
  std::operator+(&local_30,&local_38);
  std::operator+(&local_28,(char *)&local_30);
  DatanodeInfo::ToString(&DStack_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,&local_28
                );
  std::string::~string(&DStack_68);
  std::string::~string(&local_28);
  std::string::~string(&local_30);
  std::string::~string(&DStack_68.storage_type_);
  std::string::~string(&local_38);
  std::string::~string(&local_40);
  std::string::~string(&DStack_68.location_class_);
  std::string::~string(&local_48);
  std::string::~string(&DStack_68.port_);
  std::string::~string(local_20);
  return (string)(_Alloc_hider)this;
}

Assistant:

string ToString() const {
    return "BlockInfo:: " + to_string(lba_) + ", " + to_string(addr_) + ", " +
           to_string(length_) + " " + datanode_info_.ToString();
  }